

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReorderLocals.cpp
# Opt level: O2

Pass * wasm::createReorderLocalsPass(void)

{
  ReorderLocals *this;
  
  this = (ReorderLocals *)operator_new(0x140);
  memset(this,0,0x140);
  ReorderLocals::ReorderLocals(this);
  return (Pass *)this;
}

Assistant:

Pass* createReorderLocalsPass() { return new ReorderLocals(); }